

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsbr.hpp
# Opt level: O2

type unodb::qsbr_state::inc_thread_count(type word)

{
  qsbr_epoch qVar1;
  bool bVar2;
  qsbr_thread_count_type qVar3;
  qsbr_thread_count_type qVar4;
  undefined8 in_RAX;
  type word_00;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  assert_invariants(word);
  word_00 = word + 0x100000000;
  assert_invariants(word_00);
  qVar1 = get_epoch(word);
  uStack_28 = CONCAT17(qVar1.epoch_val,(undefined7)uStack_28);
  qVar1 = get_epoch(word_00);
  bVar2 = detail::qsbr_epoch::operator==((qsbr_epoch *)((long)&uStack_28 + 7),qVar1);
  if (!bVar2) {
    __assert_fail("get_epoch(word) == get_epoch(result)",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/qsbr.hpp"
                  ,0x117,"static type unodb::qsbr_state::inc_thread_count(type)");
  }
  qVar3 = get_threads_in_previous_epoch(word);
  qVar4 = get_threads_in_previous_epoch(word_00);
  if (qVar3 == qVar4) {
    qVar3 = get_thread_count(word);
    qVar4 = get_thread_count(word_00);
    if (qVar3 + 1 == qVar4) {
      return word_00;
    }
    __assert_fail("get_thread_count(word) + 1 == get_thread_count(result)",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/qsbr.hpp"
                  ,0x11a,"static type unodb::qsbr_state::inc_thread_count(type)");
  }
  __assert_fail("get_threads_in_previous_epoch(word) == get_threads_in_previous_epoch(result)",
                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/qsbr.hpp"
                ,0x119,"static type unodb::qsbr_state::inc_thread_count(type)");
}

Assistant:

[[nodiscard, gnu::const]] static constexpr type inc_thread_count(
      type word) noexcept {
    assert_invariants(word);

    const auto result = word + one_thread_in_count;

    assert_invariants(result);
    UNODB_DETAIL_ASSERT(get_epoch(word) == get_epoch(result));
    UNODB_DETAIL_ASSERT(get_threads_in_previous_epoch(word) ==
                        get_threads_in_previous_epoch(result));
    UNODB_DETAIL_ASSERT(get_thread_count(word) + 1 == get_thread_count(result));

    return result;
  }